

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testfunc.cpp
# Opt level: O0

bool __thiscall trun::TestFunc::ShouldExecuteNoDeps(TestFunc *this)

{
  kState kVar1;
  Config *pCVar2;
  TestFunc *this_local;
  
  kVar1 = State(this);
  if (kVar1 == Idle) {
    if ((this->testScope == kModuleMain) || (this->testScope == kModuleExit)) {
      pCVar2 = Config::Instance();
      this_local._7_1_ = (bool)(pCVar2->testModuleGlobals & 1);
    }
    else {
      pCVar2 = Config::Instance();
      this_local._7_1_ = caseMatch(&this->caseName,&pCVar2->testcases);
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool TestFunc::ShouldExecuteNoDeps() {
    // Unless Idle - the rest doesn't matter...
    if (State() != kState::Idle) {
        return false;
    }
    if ((testScope == kTestScope::kModuleMain) || (testScope == kTestScope::kModuleExit)) {
        return Config::Instance().testModuleGlobals;
    }

    return caseMatch(caseName, Config::Instance().testcases);
}